

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O0

qreal __thiscall ElasticEase::value(ElasticEase *this,qreal t)

{
  qreal p_00;
  qreal in_RDI;
  qreal in_XMM0_Qa;
  qreal a;
  qreal p;
  qreal a_00;
  qreal t_00;
  qreal in_stack_fffffffffffffff8;
  
  if (0.0 < *(double *)((long)in_RDI + 0x10) || *(double *)((long)in_RDI + 0x10) == 0.0) {
    t_00 = *(qreal *)((long)in_RDI + 0x10);
  }
  else {
    t_00 = 0.3;
  }
  if (0.0 < *(double *)((long)in_RDI + 0x18) || *(double *)((long)in_RDI + 0x18) == 0.0) {
    a_00 = *(qreal *)((long)in_RDI + 0x18);
  }
  else {
    a_00 = 1.0;
  }
  p_00 = (qreal)(ulong)(*(int *)((long)in_RDI + 8) - 0x1d);
  switch(p_00) {
  case 0.0:
    in_XMM0_Qa = easeInElastic(a_00,p_00,3.66534456942829e-317);
    break;
  case 4.94065645841247e-324:
    in_XMM0_Qa = easeOutElastic(a_00,p_00,3.66535988546331e-317);
    break;
  case 9.88131291682493e-324:
    in_XMM0_Qa = easeInOutElastic(in_stack_fffffffffffffff8,in_RDI,in_XMM0_Qa);
    break;
  case 1.48219693752374e-323:
    in_XMM0_Qa = easeOutInElastic(t_00,a_00,p_00);
  }
  return in_XMM0_Qa;
}

Assistant:

qreal value(qreal t) override
    {
        qreal p = (_p < 0) ? qreal(0.3) : _p;
        qreal a = (_a < 0) ? qreal(1.0) : _a;
        switch (_t) {
        case QEasingCurve::InElastic:
            return easeInElastic(t, a, p);
        case QEasingCurve::OutElastic:
            return easeOutElastic(t, a, p);
        case QEasingCurve::InOutElastic:
            return easeInOutElastic(t, a, p);
        case QEasingCurve::OutInElastic:
            return easeOutInElastic(t, a, p);
        default:
            return t;
        }
    }